

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O2

void __thiscall CGL::SceneObjects::BVHAccel::~BVHAccel(BVHAccel *this)

{
  BVHNode *this_00;
  pointer ppPVar1;
  
  (this->super_Aggregate).super_Primitive._vptr_Primitive = (_func_int **)&PTR_get_bbox_0011ab40;
  this_00 = this->root;
  if (this_00 != (BVHNode *)0x0) {
    BVHNode::~BVHNode(this_00);
    operator_delete(this_00);
  }
  ppPVar1 = (this->primitives).
            super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->primitives).
      super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppPVar1) {
    (this->primitives).
    super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppPVar1;
  }
  std::_Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  ::~_Vector_base(&(this->primitives).
                   super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
                 );
  Aggregate::~Aggregate(&this->super_Aggregate);
  return;
}

Assistant:

BVHAccel::~BVHAccel() {
  if (root)
    delete root;
  primitives.clear();
}